

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::Result::~Result(Result *this)

{
  Result *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Result_00141848;
  std::__cxx11::string::~string((string *)&this->details);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~Result			(void) {}